

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,true>
               (string_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  int32_t iVar1;
  unsigned_long *puVar2;
  date_t dVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  char **ppcVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  char **local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar1 = rdata->days;
      local_68 = &(ldata->value).pointer.ptr;
      iVar9 = 0;
      iVar6 = count;
      do {
        specifier_01.value._8_4_ = iVar1;
        specifier_01.value._0_8_ = *local_68;
        specifier_01.value._12_4_ = 0;
        dVar3 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                          (*(DateTruncBinaryOperator **)(local_68 + -1),specifier_01,(int32_t)iVar6)
        ;
        result_data[iVar9].days = dVar3.days;
        iVar9 = iVar9 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar11 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar2[uVar5];
      }
      uVar12 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar12 = count;
      }
      uVar4 = uVar12;
      if (uVar10 != 0) {
        uVar4 = uVar11;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar11 < uVar12) {
            iVar1 = rdata->days;
            ppcVar7 = &ldata[uVar11].value.pointer.ptr;
            uVar10 = uVar5;
            do {
              specifier.value._8_4_ = iVar1;
              specifier.value._0_8_ = *ppcVar7;
              specifier.value._12_4_ = 0;
              dVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar7 + -1),specifier,
                                 (int32_t)uVar10);
              result_data[uVar11].days = dVar3.days;
              uVar11 = uVar11 + 1;
              ppcVar7 = ppcVar7 + 2;
              uVar4 = uVar11;
            } while (uVar12 != uVar11);
          }
        }
        else if (uVar11 < uVar12) {
          ppcVar7 = &ldata[uVar11].value.pointer.ptr;
          uVar8 = 0;
          uVar4 = uVar5;
          do {
            if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
              specifier_00.value._8_4_ = rdata->days;
              specifier_00.value._0_8_ = *ppcVar7;
              specifier_00.value._12_4_ = 0;
              dVar3 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar7 + -1),specifier_00,
                                 (int32_t)uVar4);
              result_data[uVar11 + uVar8].days = dVar3.days;
            }
            uVar8 = uVar8 + 1;
            ppcVar7 = ppcVar7 + 2;
          } while ((uVar11 - uVar12) + uVar8 != 0);
          uVar4 = uVar11 + uVar8;
        }
      }
      uVar5 = uVar5 + 1;
      uVar11 = uVar4;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}